

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

uint ZSTD_isFrame(void *buffer,size_t size)

{
  uint uVar1;
  
  uVar1 = 0;
  if (3 < size) {
    uVar1 = 1;
    if (*buffer != 0xfd2fb528) {
      uVar1 = (uint)((*buffer & 0xfffffff0) == 0x184d2a50);
    }
  }
  return uVar1;
}

Assistant:

unsigned ZSTD_isFrame(const void* buffer, size_t size)
{
    if (size < ZSTD_frameIdSize) return 0;
    {   U32 const magic = MEM_readLE32(buffer);
        if (magic == ZSTD_MAGICNUMBER) return 1;
        if ((magic & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) return 1;
    }
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(buffer, size)) return 1;
#endif
    return 0;
}